

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listimagewindow.cc
# Opt level: O0

void __thiscall bgui::ListImageWindow::updateTitle(ListImageWindow *this)

{
  int iVar1;
  reference pvVar2;
  ostream *poVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ostream *poVar4;
  ImageWindow *in_RDI;
  ostringstream os;
  ImageAdapterBase *adapt;
  char *in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd4;
  undefined8 in_stack_fffffffffffffe10;
  undefined1 size_max;
  ostringstream *this_00;
  undefined8 in_stack_fffffffffffffe18;
  ImageAdapterBase *in_stack_fffffffffffffe28;
  ImageWindow *in_stack_fffffffffffffe30;
  string local_1b8 [48];
  ostringstream local_188 [376];
  ImageAdapterBase *local_10;
  
  size_max = (undefined1)((ulong)in_stack_fffffffffffffe10 >> 0x38);
  local_10 = ImageWindow::getAdapter(in_RDI);
  if (local_10 == (ImageAdapterBase *)0x0) {
    ImageWindow::setAdapter
              (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,SUB81((ulong)in_RDI >> 0x38,0),
               (keep)in_RDI,(int)((ulong)in_stack_fffffffffffffe18 >> 0x20),
               (int)in_stack_fffffffffffffe18,(bool)size_max);
    BaseWindow::setTitle
              ((BaseWindow *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
               in_stack_fffffffffffffdc8);
    BaseWindow::setInfoText
              ((BaseWindow *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
               in_stack_fffffffffffffdc8);
  }
  else {
    this_00 = local_188;
    std::__cxx11::ostringstream::ostringstream(this_00);
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)(in_RDI + 1),(long)*(int *)&in_RDI[1].field_0x30);
    poVar3 = std::operator<<((ostream *)this_00,(string *)pvVar2);
    poVar3 = std::operator<<(poVar3," - ");
    iVar1 = (*local_10->_vptr_ImageAdapterBase[5])();
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,CONCAT44(extraout_var,iVar1));
    poVar3 = std::operator<<(poVar3,"x");
    iVar1 = (*local_10->_vptr_ImageAdapterBase[6])();
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,CONCAT44(extraout_var_00,iVar1));
    poVar3 = std::operator<<(poVar3,"x");
    iVar1 = (*local_10->_vptr_ImageAdapterBase[7])();
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
    poVar4 = std::operator<<(poVar3," ");
    (*local_10->_vptr_ImageAdapterBase[8])(local_1b8);
    std::operator<<(poVar4,local_1b8);
    std::__cxx11::string::~string(local_1b8);
    if (*(int *)&in_RDI[2].super_BaseWindow._vptr_BaseWindow != 0) {
      std::operator<<((ostream *)local_188," -");
      if (*(int *)&in_RDI[2].super_BaseWindow._vptr_BaseWindow == 1) {
        poVar4 = std::operator<<((ostream *)local_188," ");
        std::operator<<(poVar4,"keep");
      }
      if (*(int *)&in_RDI[2].super_BaseWindow._vptr_BaseWindow == 2) {
        poVar4 = std::operator<<((ostream *)local_188," ");
        std::operator<<(poVar4,"keep_all");
      }
    }
    std::__cxx11::ostringstream::str();
    std::__cxx11::string::c_str();
    BaseWindow::setTitle((BaseWindow *)CONCAT44(iVar1,in_stack_fffffffffffffdd0),(char *)poVar3);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe28);
    BaseWindow::setInfoText((BaseWindow *)CONCAT44(iVar1,in_stack_fffffffffffffdd0),(char *)poVar3);
    std::__cxx11::ostringstream::~ostringstream(local_188);
  }
  return;
}

Assistant:

void ListImageWindow::updateTitle()
{
  ImageAdapterBase *adapt=getAdapter();

  // set image adapter and title

  if (adapt != 0)
  {
    std::ostringstream os;

    os << name[current] << " - " << adapt->getOriginalWidth() << "x" <<
       adapt->getOriginalHeight() << "x" << adapt->getOriginalDepth() <<
       " " << adapt->getOriginalType();

    if (kp != keep_none)
    {
      os << " -";

      if (kp == keep_most)
      {
        os << " " << "keep";
      }

      if (kp == keep_all)
      {
        os << " " << "keep_all";
      }
    }

    setTitle(os.str().c_str());
    setInfoText("");
  }
  else
  {
    setAdapter(0);
    setTitle("Image");
    setInfoText("No image!");
  }
}